

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsC.cxx
# Opt level: O0

bool __thiscall
cmDependsC::WriteDependencies
          (cmDependsC *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *sources,string *obj,ostream *makeDepends,ostream *internalDepends)

{
  string *this_00;
  cmLocalGenerator *pcVar1;
  bool bVar2;
  uint uVar3;
  BOM BVar4;
  ulong uVar5;
  pointer ppVar6;
  const_iterator __first;
  const_iterator __last;
  size_type sVar7;
  reference pvVar8;
  char *pcVar9;
  pointer ppVar10;
  reference dir_00;
  mapped_type *this_01;
  pointer ppVar11;
  pointer pUVar12;
  reference __x;
  ostream *poVar13;
  reference pbVar14;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar15;
  bool local_5d1;
  byte local_539;
  string local_538;
  _Self local_518;
  _Self local_510;
  const_iterator i_1;
  string obj_m;
  string obj_i;
  string dir;
  long lStack_490;
  BOM bom;
  ifstream fin;
  _Self local_278;
  _Self local_270;
  __normal_iterator<cmDependsC::UnscannedEntry_*,_std::vector<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>_>
  local_268;
  __normal_iterator<cmDependsC::UnscannedEntry_*,_std::vector<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>_>
  local_260;
  __normal_iterator<const_cmDependsC::UnscannedEntry_*,_std::vector<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>_>
  local_258;
  const_iterator incIt;
  _Self local_240;
  _Self local_238;
  iterator fileIt;
  _Self local_220;
  _Self local_218;
  int local_20c;
  string local_208;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1e8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1e0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1d8;
  const_iterator i;
  _Self local_1c8;
  iterator headerLocationIt;
  string fullName;
  UnscannedEntry current;
  string tempPathStr;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  scanned;
  undefined1 local_100 [8];
  UnscannedEntry root;
  _Self local_b8;
  const_iterator srcIt;
  int srcFiles;
  _Self local_98 [3];
  _Self local_80;
  const_iterator tmpIt;
  undefined1 local_70 [7];
  bool haveDeps;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dependencies;
  ostream *internalDepends_local;
  ostream *makeDepends_local;
  string *obj_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *sources_local;
  cmDependsC *this_local;
  
  bVar2 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(sources);
  local_539 = 1;
  if (!bVar2) {
    dependencies._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(sources);
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator->((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&dependencies._M_t._M_impl.super__Rb_tree_header._M_node_count);
    local_539 = std::__cxx11::string::empty();
  }
  if ((local_539 & 1) != 0) {
    cmSystemTools::Error
              ("Cannot scan dependencies without a source file.",(char *)0x0,(char *)0x0,(char *)0x0
              );
    this_local._7_1_ = 0;
    goto LAB_0078d7c7;
  }
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) != 0) {
    cmSystemTools::Error
              ("Cannot scan dependencies without an object file.",(char *)0x0,(char *)0x0,
               (char *)0x0);
    this_local._7_1_ = 0;
    goto LAB_0078d7c7;
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_70);
  tmpIt._M_node._7_1_ = 0;
  if (this->ValidDeps !=
      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
       *)0x0) {
    local_80._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
         ::find(this->ValidDeps,obj);
    local_98[0]._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
         ::end(this->ValidDeps);
    bVar2 = std::operator!=(&local_80,local_98);
    if (bVar2) {
      ppVar6 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>
               ::operator->(&local_80);
      __first = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin(&(ppVar6->second).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       );
      ppVar6 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>
               ::operator->(&local_80);
      __last = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(&(ppVar6->second).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    );
      std::
      set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::
      insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_70,
                 (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )__first._M_current,
                 (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )__last._M_current);
      tmpIt._M_node._7_1_ = 1;
    }
  }
  if ((tmpIt._M_node._7_1_ & 1) == 0) {
    sVar7 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(sources);
    srcIt._M_node._4_4_ = (int)sVar7;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&this->Encountered);
    local_b8._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(sources);
    while( true ) {
      root.QuotedLocation.field_2._8_8_ =
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(sources);
      bVar2 = std::operator!=(&local_b8,(_Self *)((long)&root.QuotedLocation.field_2 + 8));
      if (!bVar2) break;
      UnscannedEntry::UnscannedEntry((UnscannedEntry *)local_100);
      pbVar14 = std::
                _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*(&local_b8);
      std::__cxx11::string::operator=((string *)local_100,(string *)pbVar14);
      std::
      queue<cmDependsC::UnscannedEntry,_std::deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>_>
      ::push(&this->Unscanned,(value_type *)local_100);
      pbVar14 = std::
                _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*(&local_b8);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(&this->Encountered,pbVar14);
      UnscannedEntry::~UnscannedEntry((UnscannedEntry *)local_100);
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_b8);
    }
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)((long)&tempPathStr.field_2 + 8));
    this_00 = (string *)(current.QuotedLocation.field_2._M_local_buf + 8);
    std::__cxx11::string::string(this_00);
    std::__cxx11::string::reserve((ulong)this_00);
    do {
      bVar2 = std::
              queue<cmDependsC::UnscannedEntry,_std::deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>_>
              ::empty(&this->Unscanned);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        local_20c = 0;
        break;
      }
      pvVar8 = std::
               queue<cmDependsC::UnscannedEntry,_std::deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>_>
               ::front(&this->Unscanned);
      UnscannedEntry::UnscannedEntry((UnscannedEntry *)((long)&fullName.field_2 + 8),pvVar8);
      std::
      queue<cmDependsC::UnscannedEntry,_std::deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>_>
      ::pop(&this->Unscanned);
      std::__cxx11::string::string((string *)&headerLocationIt);
      if (srcIt._M_node._4_4_ < 1) {
        pcVar9 = (char *)std::__cxx11::string::c_str();
        bVar2 = cmsys::SystemTools::FileIsFullPath(pcVar9);
        if (bVar2) goto LAB_0078cd02;
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          pcVar9 = (char *)std::__cxx11::string::c_str();
          bVar2 = cmsys::SystemTools::FileExists(pcVar9,true);
          if (!bVar2) goto LAB_0078cde2;
          std::__cxx11::string::operator=
                    ((string *)&headerLocationIt,
                     (string *)(current.FileName.field_2._M_local_buf + 8));
        }
        else {
LAB_0078cde2:
          local_1c8._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::find(&this->HeaderLocationCache,(key_type *)((long)&fullName.field_2 + 8));
          i._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::end(&this->HeaderLocationCache);
          bVar2 = std::operator!=(&local_1c8,(_Self *)&i);
          if (bVar2) {
            ppVar10 = std::
                      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator->(&local_1c8);
            std::__cxx11::string::operator=((string *)&headerLocationIt,(string *)&ppVar10->second);
          }
          else {
            local_1e0._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(&(this->super_cmDepends).IncludePath);
            __gnu_cxx::
            __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ::__normal_iterator<std::__cxx11::string*>
                      ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        *)&local_1d8,&local_1e0);
            while( true ) {
              local_1e8._M_current =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end(&(this->super_cmDepends).IncludePath);
              bVar2 = __gnu_cxx::operator!=(&local_1d8,&local_1e8);
              if (!bVar2) break;
              dir_00 = __gnu_cxx::
                       __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator*(&local_1d8);
              cmSystemTools::CollapseCombinedPath
                        (&local_208,dir_00,(string *)((long)&fullName.field_2 + 8));
              std::__cxx11::string::operator=
                        ((string *)(current.QuotedLocation.field_2._M_local_buf + 8),
                         (string *)&local_208);
              std::__cxx11::string::~string((string *)&local_208);
              pcVar9 = (char *)std::__cxx11::string::c_str();
              bVar2 = cmsys::SystemTools::FileExists(pcVar9,true);
              if (bVar2) {
                std::__cxx11::string::operator=
                          ((string *)&headerLocationIt,
                           (string *)(current.QuotedLocation.field_2._M_local_buf + 8));
                this_01 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator[](&this->HeaderLocationCache,
                                       (key_type *)((long)&fullName.field_2 + 8));
                std::__cxx11::string::operator=((string *)this_01,(string *)&headerLocationIt);
                break;
              }
              __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&local_1d8);
            }
          }
        }
      }
      else {
LAB_0078cd02:
        pcVar9 = (char *)std::__cxx11::string::c_str();
        bVar2 = cmsys::SystemTools::FileExists(pcVar9,true);
        if (bVar2) {
          std::__cxx11::string::operator=
                    ((string *)&headerLocationIt,(string *)(fullName.field_2._M_local_buf + 8));
        }
      }
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
LAB_0078d045:
        uVar3 = std::__cxx11::string::empty();
        local_5d1 = false;
        if ((uVar3 & 1) == 0) {
          local_218._M_node =
               (_Base_ptr)
               std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&tempPathStr.field_2 + 8),(key_type *)&headerLocationIt);
          local_220._M_node =
               (_Base_ptr)
               std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&tempPathStr.field_2 + 8));
          local_5d1 = std::operator==(&local_218,&local_220);
        }
        if (local_5d1 != false) {
          pVar15 = std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)((long)&tempPathStr.field_2 + 8),(value_type *)&headerLocationIt);
          fileIt._M_node = (_Base_ptr)pVar15.first._M_node;
          local_238._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines_*>_>_>
               ::find(&this->FileCache,(key_type *)&headerLocationIt);
          local_240._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines_*>_>_>
               ::end(&this->FileCache);
          bVar2 = std::operator!=(&local_238,&local_240);
          if (bVar2) {
            ppVar11 = std::
                      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines_*>_>
                      ::operator->(&local_238);
            ppVar11->second->Used = true;
            pVar15 = std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_70,(value_type *)&headerLocationIt);
            incIt._M_current = (UnscannedEntry *)pVar15.first._M_node;
            ppVar11 = std::
                      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines_*>_>
                      ::operator->(&local_238);
            local_260._M_current =
                 (UnscannedEntry *)
                 std::
                 vector<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>::
                 begin(&ppVar11->second->UnscannedEntries);
            __gnu_cxx::
            __normal_iterator<cmDependsC::UnscannedEntry_const*,std::vector<cmDependsC::UnscannedEntry,std::allocator<cmDependsC::UnscannedEntry>>>
            ::__normal_iterator<cmDependsC::UnscannedEntry*>
                      ((__normal_iterator<cmDependsC::UnscannedEntry_const*,std::vector<cmDependsC::UnscannedEntry,std::allocator<cmDependsC::UnscannedEntry>>>
                        *)&local_258,&local_260);
            while( true ) {
              ppVar11 = std::
                        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines_*>_>
                        ::operator->(&local_238);
              local_268._M_current =
                   (UnscannedEntry *)
                   std::
                   vector<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>::
                   end(&ppVar11->second->UnscannedEntries);
              bVar2 = __gnu_cxx::operator!=(&local_258,&local_268);
              if (!bVar2) break;
              pUVar12 = __gnu_cxx::
                        __normal_iterator<const_cmDependsC::UnscannedEntry_*,_std::vector<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>_>
                        ::operator->(&local_258);
              local_270._M_node =
                   (_Base_ptr)
                   std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find(&this->Encountered,&pUVar12->FileName);
              local_278._M_node =
                   (_Base_ptr)
                   std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end(&this->Encountered);
              bVar2 = std::operator==(&local_270,&local_278);
              if (bVar2) {
                pUVar12 = __gnu_cxx::
                          __normal_iterator<const_cmDependsC::UnscannedEntry_*,_std::vector<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>_>
                          ::operator->(&local_258);
                std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert(&this->Encountered,&pUVar12->FileName);
                __x = __gnu_cxx::
                      __normal_iterator<const_cmDependsC::UnscannedEntry_*,_std::vector<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>_>
                      ::operator*(&local_258);
                std::
                queue<cmDependsC::UnscannedEntry,_std::deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>_>
                ::push(&this->Unscanned,__x);
              }
              __gnu_cxx::
              __normal_iterator<const_cmDependsC::UnscannedEntry_*,_std::vector<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>_>
              ::operator++(&local_258);
            }
          }
          else {
            pcVar9 = (char *)std::__cxx11::string::c_str();
            std::ifstream::ifstream(&stack0xfffffffffffffb70,pcVar9,_S_in);
            bVar2 = std::ios::operator_cast_to_bool
                              ((ios *)((long)&stack0xfffffffffffffb70 +
                                      *(long *)(lStack_490 + -0x18)));
            if ((bVar2) &&
               ((BVar4 = cmsys::FStream::ReadBOM((istream *)&stack0xfffffffffffffb70),
                BVar4 == BOM_None || (BVar4 == BOM_UTF8)))) {
              std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_70,(value_type *)&headerLocationIt);
              cmsys::SystemTools::GetFilenamePath
                        ((string *)((long)&obj_i.field_2 + 8),(string *)&headerLocationIt);
              pcVar9 = (char *)std::__cxx11::string::c_str();
              Scan(this,(istream *)&stack0xfffffffffffffb70,pcVar9,(string *)&headerLocationIt);
              std::__cxx11::string::~string((string *)(obj_i.field_2._M_local_buf + 8));
            }
            std::ifstream::~ifstream(&stack0xfffffffffffffb70);
          }
        }
        srcIt._M_node._4_4_ = srcIt._M_node._4_4_ + -1;
        local_20c = 0;
      }
      else {
        pcVar9 = (char *)std::__cxx11::string::c_str();
        bVar2 = cmsys::RegularExpression::find(&this->IncludeRegexComplain,pcVar9);
        if (!bVar2) goto LAB_0078d045;
        pcVar9 = (char *)std::__cxx11::string::c_str();
        cmSystemTools::Error("Cannot find file \"",pcVar9,"\".",(char *)0x0);
        this_local._7_1_ = 0;
        local_20c = 1;
      }
      std::__cxx11::string::~string((string *)&headerLocationIt);
      UnscannedEntry::~UnscannedEntry((UnscannedEntry *)((long)&fullName.field_2 + 8));
    } while (local_20c == 0);
    std::__cxx11::string::~string((string *)(current.QuotedLocation.field_2._M_local_buf + 8));
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&tempPathStr.field_2 + 8));
    if (local_20c == 0) goto LAB_0078d546;
  }
  else {
LAB_0078d546:
    cmOutputConverter::Convert
              ((string *)((long)&obj_m.field_2 + 8),
               &((this->super_cmDepends).LocalGenerator)->super_cmOutputConverter,obj,HOME_OUTPUT,
               UNCHANGED);
    cmOutputConverter::ConvertToOutputFormat
              ((string *)&i_1,&((this->super_cmDepends).LocalGenerator)->super_cmOutputConverter,
               (string *)((long)&obj_m.field_2 + 8),MAKERULE);
    poVar13 = std::operator<<(internalDepends,(string *)(obj_m.field_2._M_local_buf + 8));
    std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
    local_510._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_70);
    while( true ) {
      local_518._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_70);
      bVar2 = std::operator!=(&local_510,&local_518);
      if (!bVar2) break;
      poVar13 = std::operator<<(makeDepends,(string *)&i_1);
      poVar13 = std::operator<<(poVar13,": ");
      pcVar1 = (this->super_cmDepends).LocalGenerator;
      pbVar14 = std::
                _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*(&local_510);
      cmOutputConverter::Convert
                (&local_538,&pcVar1->super_cmOutputConverter,pbVar14,HOME_OUTPUT,MAKERULE);
      poVar13 = std::operator<<(poVar13,(string *)&local_538);
      std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_538);
      poVar13 = std::operator<<(internalDepends," ");
      pbVar14 = std::
                _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*(&local_510);
      poVar13 = std::operator<<(poVar13,(string *)pbVar14);
      std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_510);
    }
    std::ostream::operator<<(makeDepends,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = 1;
    local_20c = 1;
    std::__cxx11::string::~string((string *)&i_1);
    std::__cxx11::string::~string((string *)(obj_m.field_2._M_local_buf + 8));
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_70);
LAB_0078d7c7:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmDependsC::WriteDependencies(const std::set<std::string>& sources,
                                   const std::string& obj,
                                   std::ostream& makeDepends,
                                   std::ostream& internalDepends)
{
  // Make sure this is a scanning instance.
  if(sources.empty() || sources.begin()->empty())
    {
    cmSystemTools::Error("Cannot scan dependencies without a source file.");
    return false;
    }
  if(obj.empty())
    {
    cmSystemTools::Error("Cannot scan dependencies without an object file.");
    return false;
    }

  std::set<std::string> dependencies;
  bool haveDeps = false;

  if (this->ValidDeps != 0)
    {
    std::map<std::string, DependencyVector>::const_iterator tmpIt =
                                                    this->ValidDeps->find(obj);
    if (tmpIt!= this->ValidDeps->end())
      {
      dependencies.insert(tmpIt->second.begin(), tmpIt->second.end());
      haveDeps = true;
      }
    }

  if (!haveDeps)
    {
    // Walk the dependency graph starting with the source file.
    int srcFiles = (int)sources.size();
    this->Encountered.clear();

    for(std::set<std::string>::const_iterator srcIt = sources.begin();
        srcIt != sources.end(); ++srcIt)
      {
      UnscannedEntry root;
      root.FileName = *srcIt;
      this->Unscanned.push(root);
      this->Encountered.insert(*srcIt);
      }

    std::set<std::string> scanned;

    // Use reserve to allocate enough memory for tempPathStr
    // so that during the loops no memory is allocated or freed
    std::string tempPathStr;
    tempPathStr.reserve(4*1024);

    while(!this->Unscanned.empty())
      {
      // Get the next file to scan.
      UnscannedEntry current = this->Unscanned.front();
      this->Unscanned.pop();

      // If not a full path, find the file in the include path.
      std::string fullName;
      if((srcFiles>0)
         || cmSystemTools::FileIsFullPath(current.FileName.c_str()))
        {
        if(cmSystemTools::FileExists(current.FileName.c_str(), true))
          {
          fullName = current.FileName;
          }
        }
      else if(!current.QuotedLocation.empty() &&
              cmSystemTools::FileExists(current.QuotedLocation.c_str(), true))
        {
        // The include statement producing this entry was a double-quote
        // include and the included file is present in the directory of
        // the source containing the include statement.
        fullName = current.QuotedLocation;
        }
      else
        {
        std::map<std::string, std::string>::iterator
          headerLocationIt=this->HeaderLocationCache.find(current.FileName);
        if (headerLocationIt!=this->HeaderLocationCache.end())
          {
          fullName=headerLocationIt->second;
          }
        else for(std::vector<std::string>::const_iterator i =
              this->IncludePath.begin(); i != this->IncludePath.end(); ++i)
          {
          // Construct the name of the file as if it were in the current
          // include directory.  Avoid using a leading "./".

          tempPathStr =
            cmSystemTools::CollapseCombinedPath(*i, current.FileName);

          // Look for the file in this location.
          if(cmSystemTools::FileExists(tempPathStr.c_str(), true))
            {
            fullName = tempPathStr;
            HeaderLocationCache[current.FileName]=fullName;
            break;
            }
          }
        }

      // Complain if the file cannot be found and matches the complain
      // regex.
      if(fullName.empty() &&
        this->IncludeRegexComplain.find(current.FileName.c_str()))
        {
        cmSystemTools::Error("Cannot find file \"",
                            current.FileName.c_str(), "\".");
        return false;
        }

      // Scan the file if it was found and has not been scanned already.
      if(!fullName.empty() && (scanned.find(fullName) == scanned.end()))
        {
        // Record scanned files.
        scanned.insert(fullName);

        // Check whether this file is already in the cache
        std::map<std::string, cmIncludeLines*>::iterator fileIt=
          this->FileCache.find(fullName);
        if (fileIt!=this->FileCache.end())
          {
          fileIt->second->Used=true;
          dependencies.insert(fullName);
          for (std::vector<UnscannedEntry>::const_iterator incIt=
                fileIt->second->UnscannedEntries.begin();
              incIt!=fileIt->second->UnscannedEntries.end(); ++incIt)
            {
            if (this->Encountered.find(incIt->FileName) ==
                this->Encountered.end())
              {
              this->Encountered.insert(incIt->FileName);
              this->Unscanned.push(*incIt);
              }
            }
          }
        else
          {

          // Try to scan the file.  Just leave it out if we cannot find
          // it.
          cmsys::ifstream fin(fullName.c_str());
          if(fin)
            {
            cmsys::FStream::BOM bom = cmsys::FStream::ReadBOM(fin);
            if(bom == cmsys::FStream::BOM_None ||
               bom == cmsys::FStream::BOM_UTF8)
              {
              // Add this file as a dependency.
              dependencies.insert(fullName);

              // Scan this file for new dependencies.  Pass the directory
              // containing the file to handle double-quote includes.
              std::string dir = cmSystemTools::GetFilenamePath(fullName);
              this->Scan(fin, dir.c_str(), fullName);
              }
            else
              {
              // Skip file with encoding we do not implement.
              }
            }
          }
        }

      srcFiles--;
      }
    }

  // Write the dependencies to the output stream.  Makefile rules
  // written by the original local generator for this directory
  // convert the dependencies to paths relative to the home output
  // directory.  We must do the same here.
  std::string obj_i =
    this->LocalGenerator->Convert(obj, cmLocalGenerator::HOME_OUTPUT);
  std::string obj_m =
    this->LocalGenerator->ConvertToOutputFormat(obj_i,
                                                cmLocalGenerator::MAKERULE);
  internalDepends << obj_i << std::endl;

  for(std::set<std::string>::const_iterator i=dependencies.begin();
      i != dependencies.end(); ++i)
    {
    makeDepends << obj_m << ": " <<
      this->LocalGenerator->Convert(*i,
                                    cmLocalGenerator::HOME_OUTPUT,
                                    cmLocalGenerator::MAKERULE)
                << std::endl;
    internalDepends << " " << *i << std::endl;
    }
  makeDepends << std::endl;

  return true;
}